

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenAtomicCmpxchg
          (BinaryenModuleRef module,BinaryenIndex bytes,BinaryenIndex offset,
          BinaryenExpressionRef ptr,BinaryenExpressionRef expected,BinaryenExpressionRef replacement
          ,BinaryenType type,char *memoryName)

{
  AtomicCmpxchg *pAVar1;
  Address offset_00;
  Name memory;
  Builder local_38;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  local_38.wasm = module;
  memory = getMemoryName(module,memoryName);
  pAVar1 = wasm::Builder::makeAtomicCmpxchg
                     (&local_38,bytes,offset_00,ptr,expected,replacement,(Type)type,memory);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicCmpxchg(BinaryenModuleRef module,
                                            BinaryenIndex bytes,
                                            BinaryenIndex offset,
                                            BinaryenExpressionRef ptr,
                                            BinaryenExpressionRef expected,
                                            BinaryenExpressionRef replacement,
                                            BinaryenType type,
                                            const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicCmpxchg(bytes,
                         offset,
                         (Expression*)ptr,
                         (Expression*)expected,
                         (Expression*)replacement,
                         Type(type),
                         getMemoryName(module, memoryName)));
}